

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers_iforest.hpp
# Opt level: O1

vector<double,_std::allocator<double>_> *
calc_kurtosis_all_data<InputData<double,int>,double>
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,
          InputData<double,_int> *input_data,ModelParams *model_params,Xoshiro256PP *rnd_generator)

{
  int *Xc_indptr;
  double *pdVar1;
  double *pdVar2;
  double *buffer_prob;
  ulong uVar3;
  double *pdVar4;
  vector<double,_std::allocator<double>_> *__range1;
  ulong uVar5;
  double dVar6;
  size_t *local_40;
  allocator_type local_31;
  
  if (input_data->ncols_categ == 0) {
    local_40 = (size_t *)0x0;
    buffer_prob = (double *)0x0;
  }
  else {
    uVar3 = 0xffffffffffffffff;
    if (-1 < (long)input_data->max_categ) {
      uVar3 = (long)input_data->max_categ * 8;
    }
    buffer_prob = (double *)operator_new__(uVar3);
    if ((input_data->sample_weights == (double *)0x0) || (input_data->weight_as_sample == true)) {
      uVar3 = 0xffffffffffffffff;
      if (-2 < (long)input_data->max_categ) {
        uVar3 = (long)input_data->max_categ * 8 + 8;
      }
      local_40 = (size_t *)operator_new__(uVar3);
    }
    else {
      local_40 = (size_t *)0x0;
    }
  }
  std::vector<double,_std::allocator<double>_>::vector
            (__return_storage_ptr__,input_data->ncols_categ + input_data->ncols_numeric,&local_31);
  uVar3 = input_data->ncols_tot;
  if (uVar3 != 0) {
    uVar5 = 0;
    do {
      uVar3 = input_data->ncols_numeric;
      if (uVar5 < uVar3) {
        Xc_indptr = input_data->Xc_indptr;
        if (Xc_indptr == (int *)0x0) {
          if ((input_data->sample_weights == (double *)0x0) ||
             (input_data->weight_as_sample == true)) {
            dVar6 = calc_kurtosis<double,double>
                              (input_data->numeric_data + input_data->nrows * uVar5,
                               input_data->nrows,model_params->missing_action);
          }
          else {
            dVar6 = calc_kurtosis_weighted<double,double>
                              (input_data->numeric_data + input_data->nrows * uVar5,
                               input_data->nrows,model_params->missing_action,
                               input_data->sample_weights);
          }
        }
        else if ((input_data->sample_weights == (double *)0x0) ||
                (input_data->weight_as_sample == true)) {
          dVar6 = calc_kurtosis<double,int,double>
                            (uVar5,input_data->nrows,input_data->Xc,input_data->Xc_ind,Xc_indptr,
                             model_params->missing_action);
        }
        else {
          dVar6 = calc_kurtosis_weighted<double,int,double>
                            (uVar5,input_data->nrows,input_data->Xc,input_data->Xc_ind,Xc_indptr,
                             model_params->missing_action,input_data->sample_weights);
        }
      }
      else if ((input_data->sample_weights == (double *)0x0) ||
              (input_data->weight_as_sample == true)) {
        dVar6 = calc_kurtosis<double>
                          (input_data->nrows,
                           input_data->categ_data + (uVar5 - uVar3) * input_data->nrows,
                           input_data->ncat[uVar5 - uVar3],local_40,buffer_prob,
                           model_params->missing_action,model_params->cat_split_type,rnd_generator);
      }
      else {
        dVar6 = calc_kurtosis_weighted<double,double>
                          (input_data->nrows,
                           input_data->categ_data + (uVar5 - uVar3) * input_data->nrows,
                           input_data->ncat[uVar5 - uVar3],buffer_prob,model_params->missing_action,
                           model_params->cat_split_type,rnd_generator,input_data->sample_weights);
      }
      (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
      super__Vector_impl_data._M_start[uVar5] = dVar6;
      uVar5 = uVar5 + 1;
      uVar3 = input_data->ncols_tot;
    } while (uVar5 < uVar3);
  }
  pdVar2 = (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  pdVar1 = (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  for (pdVar4 = pdVar1; pdVar4 != pdVar2; pdVar4 = pdVar4 + 1) {
    dVar6 = 0.0;
    if ((-INFINITY < *pdVar4) && (dVar6 = *pdVar4 + -1.0, dVar6 <= 1e-08)) {
      dVar6 = 1e-08;
    }
    *pdVar4 = dVar6;
  }
  pdVar2 = input_data->col_weights;
  if (uVar3 != 0 && pdVar2 != (double *)0x0) {
    uVar5 = 0;
    do {
      if (0.0 < pdVar1[uVar5]) {
        dVar6 = pdVar1[uVar5] * pdVar2[uVar5];
        if (dVar6 <= 1e-100) {
          dVar6 = 1e-100;
        }
        pdVar1[uVar5] = dVar6;
      }
      uVar5 = uVar5 + 1;
    } while (uVar3 != uVar5);
  }
  if (local_40 != (size_t *)0x0) {
    operator_delete__(local_40);
  }
  if (buffer_prob != (double *)0x0) {
    operator_delete__(buffer_prob);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<double> calc_kurtosis_all_data(InputData &input_data, ModelParams &model_params, RNG_engine &rnd_generator)
{
    std::unique_ptr<double[]> buffer_double;
    std::unique_ptr<size_t[]> buffer_size_t;
    if (input_data.ncols_categ)
    {
        buffer_double = std::unique_ptr<double[]>(new double[input_data.max_categ]);
        if (!(input_data.sample_weights != NULL && !input_data.weight_as_sample))
            buffer_size_t = std::unique_ptr<size_t[]>(new size_t[input_data.max_categ + 1]);
    }


    std::vector<double> kurt_weights(input_data.ncols_numeric + input_data.ncols_categ);
    for (size_t col = 0; col < input_data.ncols_tot; col++)
    {
        if (col < input_data.ncols_numeric)
        {
            if (input_data.Xc_indptr == NULL)
            {
                if (!(input_data.sample_weights != NULL && !input_data.weight_as_sample))
                {
                    kurt_weights[col]
                        = calc_kurtosis<typename std::remove_pointer<decltype(input_data.numeric_data)>::type, ldouble_safe>(
                                        input_data.numeric_data + col * input_data.nrows,
                                        input_data.nrows, model_params.missing_action);
                }

                else
                {
                    kurt_weights[col]
                        = calc_kurtosis_weighted<typename std::remove_pointer<decltype(input_data.numeric_data)>::type,
                                                 ldouble_safe>(
                                                 input_data.numeric_data + col * input_data.nrows, input_data.nrows,
                                                 model_params.missing_action, input_data.sample_weights);
                }
            }

            else
            {
                if (!(input_data.sample_weights != NULL && !input_data.weight_as_sample))
                {
                    kurt_weights[col]
                        = calc_kurtosis<typename std::remove_pointer<decltype(input_data.Xc)>::type,
                                        typename std::remove_pointer<decltype(input_data.Xc_indptr)>::type,
                                        ldouble_safe>(
                                        col, input_data.nrows,
                                        input_data.Xc, input_data.Xc_ind, input_data.Xc_indptr,
                                        model_params.missing_action);
                }

                else
                {
                    kurt_weights[col]
                        = calc_kurtosis_weighted<typename std::remove_pointer<decltype(input_data.Xc)>::type,
                                                 typename std::remove_pointer<decltype(input_data.Xc_indptr)>::type,
                                                 ldouble_safe>(
                                                 col, input_data.nrows,
                                                 input_data.Xc, input_data.Xc_ind, input_data.Xc_indptr,
                                                 model_params.missing_action, input_data.sample_weights);
                }
            }
        }

        else
        {
            if (!(input_data.sample_weights != NULL && !input_data.weight_as_sample))
            {
                kurt_weights[col]
                        = calc_kurtosis<ldouble_safe>(input_data.nrows,
                                        input_data.categ_data + (col- input_data.ncols_numeric) * input_data.nrows,
                                        input_data.ncat[col - input_data.ncols_numeric],
                                        buffer_size_t.get(), buffer_double.get(),
                                        model_params.missing_action, model_params.cat_split_type, rnd_generator);
            }

            else
            {
                kurt_weights[col]
                        = calc_kurtosis_weighted<typename std::remove_pointer<decltype(input_data.sample_weights)>::type,
                                                 ldouble_safe>(
                                                 input_data.nrows,
                                                 input_data.categ_data + (col- input_data.ncols_numeric) * input_data.nrows,
                                                 input_data.ncat[col - input_data.ncols_numeric],
                                                 buffer_double.get(),
                                                 model_params.missing_action, model_params.cat_split_type,
                                                 rnd_generator, input_data.sample_weights);
            }
        }
    }

    for (auto &w : kurt_weights) w = (w == -HUGE_VAL)? 0. : std::fmax(1e-8, -1. + w);
    if (input_data.col_weights != NULL)
    {
        for (size_t col = 0; col < input_data.ncols_tot; col++)
        {
            if (kurt_weights[col] <= 0) continue;
            kurt_weights[col] *= input_data.col_weights[col];
            kurt_weights[col] = std::fmax(kurt_weights[col], 1e-100);
        }
    }

    return kurt_weights;
}